

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_keylog_callback(SSL *ssl,char *line)

{
  size_t __n;
  size_t linelen;
  char *buf;
  char stackbuf [256];
  char *line_local;
  SSL *ssl_local;
  
  if (((keylog_file_fp != (FILE *)0x0) && (line != (char *)0x0)) && (*line != '\0')) {
    stackbuf._248_8_ = line;
    __n = strlen(line);
    if (__n < 0xff) {
      linelen = (size_t)&buf;
    }
    else {
      linelen = (size_t)(*Curl_cmalloc)(__n + 2);
      if ((void *)linelen == (void *)0x0) {
        return;
      }
    }
    strncpy((char *)linelen,(char *)stackbuf._248_8_,__n);
    *(undefined1 *)(linelen + __n) = 10;
    *(undefined1 *)(linelen + 1 + __n) = 0;
    fputs((char *)linelen,(FILE *)keylog_file_fp);
    if ((char **)linelen != &buf) {
      (*Curl_cfree)((void *)linelen);
    }
  }
  return;
}

Assistant:

static void ossl_keylog_callback(const SSL *ssl, const char *line)
{
  (void)ssl;

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  if(keylog_file_fp && line && *line) {
    char stackbuf[256];
    char *buf;
    size_t linelen = strlen(line);

    if(linelen <= sizeof(stackbuf) - 2)
      buf = stackbuf;
    else {
      buf = malloc(linelen + 2);
      if(!buf)
        return;
    }
    strncpy(buf, line, linelen);
    buf[linelen] = '\n';
    buf[linelen + 1] = '\0';

    fputs(buf, keylog_file_fp);
    if(buf != stackbuf)
      free(buf);
  }
}